

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Vec_Int_t * Gia_GenCollectFlopIndexes(char *pStr,int nLutNum,int nLutSize,int nFlops)

{
  uint uVar1;
  Vec_Int_t *p_00;
  char *__nptr;
  ulong uVar2;
  Vec_Int_t *p_01;
  int *__dest;
  ulong uVar3;
  long lVar4;
  Vec_Int_t *p;
  size_t __size;
  uint nCap;
  
  nCap = nLutNum * nLutSize;
  if (nFlops < (int)nCap) {
    __assert_fail("nLutSize * nLutNum <= nFlops",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x4a,"Vec_Int_t *Gia_GenCollectFlopIndexes(char *, int, int, int)");
  }
  p_00 = Vec_IntAlloc(nCap);
  if (pStr == (char *)0x0) {
    p_00->nSize = nCap;
    uVar2 = 0;
    uVar3 = (ulong)nCap;
    if ((int)nCap < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      p_00->pArray[uVar2] = (int)uVar2;
    }
  }
  else {
    while (__nptr = strtok(pStr,", "), __nptr != (char *)0x0) {
      uVar1 = atoi(__nptr);
      if (nFlops <= (int)uVar1) {
        printf("Flop index (%d) exceeds the number of flops (%d).\n",(ulong)uVar1,
               (ulong)(uint)nFlops);
        break;
      }
      Vec_IntPush(p_00,uVar1);
      pStr = (char *)0x0;
    }
    if (p_00->nSize == nCap) {
      p_01 = (Vec_Int_t *)malloc(0x10);
      p_01->nSize = nCap;
      p_01->nCap = nCap;
      if (nCap == 0) {
        __size = 0;
        __dest = (int *)0x0;
      }
      else {
        __size = (long)(int)nCap << 2;
        __dest = (int *)malloc(__size);
      }
      p_01->pArray = __dest;
      memcpy(__dest,p_00->pArray,__size);
      uVar1 = nCap;
      if (1 < (int)nCap) {
        qsort(__dest,(ulong)nCap,4,Vec_IntSortCompare1);
        uVar1 = 1;
        for (uVar3 = 1; nCap != uVar3; uVar3 = uVar3 + 1) {
          if (__dest[uVar3] != __dest[uVar3 - 1]) {
            lVar4 = (long)(int)uVar1;
            uVar1 = uVar1 + 1;
            __dest[lVar4] = __dest[uVar3];
          }
        }
        p_01->nSize = uVar1;
      }
      Vec_IntFree(p_01);
      if (nCap - uVar1 == 0) {
        return p_00;
      }
      printf("Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n",
             (ulong)(nCap - uVar1));
    }
    else {
      printf("Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n",(ulong)nCap);
    }
    Vec_IntFree(p_00);
    p_00 = (Vec_Int_t *)0x0;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_GenCollectFlopIndexes( char * pStr, int nLutNum, int nLutSize, int nFlops )
{
    int nDups;
    char * pTemp;
    Vec_Int_t * vFlops;
    assert( nLutSize * nLutNum <= nFlops );
    if ( pStr == NULL )
        return Vec_IntStartNatural( nLutNum * nLutSize );
    vFlops = Vec_IntAlloc( nLutNum * nLutSize );
    pTemp = strtok( pStr, ", " );
    while ( pTemp )
    {
        int iFlop = atoi(pTemp);
        if ( iFlop >= nFlops )
        {
            printf( "Flop index (%d) exceeds the number of flops (%d).\n", iFlop, nFlops );
            break;
        }
        Vec_IntPush( vFlops, iFlop );
        pTemp = strtok( NULL, ", " );
    }
    if ( Vec_IntSize(vFlops) != nLutNum * nLutSize )
    {
        printf( "Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n", nLutNum * nLutSize, Vec_IntSize(vFlops) );
        Vec_IntFree( vFlops );
        return NULL;
    }
    nDups = Vec_IntCountDuplicates(vFlops);
    if ( nDups )
    {
        printf( "Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n", nDups );
        Vec_IntFree( vFlops );
        return NULL;
    }
    return vFlops;
}